

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,internal_fixup *ifx)

{
  ostream *poVar1;
  internal_fixup *ifx_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"{ section:");
  poVar1 = operator<<(poVar1,ifx->section);
  poVar1 = std::operator<<(poVar1,", type:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)ifx->type);
  poVar1 = std::operator<<(poVar1,", offset:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ifx->offset);
  poVar1 = std::operator<<(poVar1,", addend:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ifx->addend);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, internal_fixup const & ifx) {
            return os << "{ section:" << ifx.section
                      << ", type:" << static_cast<unsigned> (ifx.type) << ", offset:" << ifx.offset
                      << ", addend:" << ifx.addend << '}';
        }